

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O2

Min_Cube_t * Min_SopComplement(Min_Man_t *p,Min_Cube_t *pSharp)

{
  uint uVar1;
  long lVar2;
  uint *__ptr;
  void *pvVar3;
  Min_Cube_t *pMVar4;
  Min_Cube_t *pMVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  Min_Cube_t *pMVar9;
  int iVar10;
  int iVar11;
  Min_Cube_t *pMVar12;
  uint uVar13;
  Min_Cube_t *pCover;
  Min_Cube_t *local_40;
  Min_Cube_t *local_38;
  
  __ptr = (uint *)malloc(0x10);
  *__ptr = 100;
  pvVar3 = malloc(400);
  *(void **)(__ptr + 2) = pvVar3;
  pCover = Min_CubeAlloc(p);
  do {
    if (pSharp == (Min_Cube_t *)0x0) {
      free(*(void **)(__ptr + 2));
      free(__ptr);
      pMVar5 = pCover;
      if (pCover == (Min_Cube_t *)0x0) {
        Min_ManClean(p,p->nVars);
      }
      else {
        Min_ManClean(p,*(uint *)&pCover->field_0x8 & 0x3ff);
        pMVar9 = pMVar5->pNext;
        while (pMVar4 = pMVar9, pMVar5 != (Min_Cube_t *)0x0) {
          pMVar12 = (Min_Cube_t *)
                    ((ulong)(*(uint *)&pMVar5->field_0x8 >> 0x13 & 0xfffffff8) + (long)p->ppStore);
          pMVar9 = pMVar12;
          do {
            pMVar9 = pMVar9->pNext;
            if (pMVar9 == (Min_Cube_t *)0x0) {
              pMVar5->pNext = pMVar12->pNext;
              pMVar12->pNext = pMVar5;
              p->nCubes = p->nCubes + 1;
              goto LAB_00358350;
            }
            iVar10 = Min_CubesAreEqual(pMVar5,pMVar9);
          } while (iVar10 == 0);
          Min_CubeRecycle(p,pMVar5);
LAB_00358350:
          pMVar9 = (Min_Cube_t *)0x0;
          pMVar5 = pMVar4;
          if (pMVar4 != (Min_Cube_t *)0x0) {
            pMVar9 = pMVar4->pNext;
          }
        }
      }
      Min_SopDist1Merge(p);
      Min_SopContain(p);
      pMVar5 = Min_CoverCollect(p,p->nVars);
      return pMVar5;
    }
    pMVar5 = (Min_Cube_t *)&pCover;
LAB_0035807e:
    pMVar9 = pMVar5;
    pMVar5 = pMVar9->pNext;
    if (pMVar5 != (Min_Cube_t *)0x0) {
      uVar7 = *(uint *)&pSharp->field_0x8;
      if (((uVar7 ^ *(uint *)&pMVar5->field_0x8) & 0x3ff) != 0) {
        __assert_fail("pCube0->nVars == pCube1->nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covInt.h"
                      ,299,"int Min_CubesDisjoint(Min_Cube_t *, Min_Cube_t *)");
      }
      uVar6 = 0;
      while ((*(uint *)&pMVar5->field_0x8 >> 10 & 0xfff) != uVar6) {
        uVar8 = pSharp->uData[uVar6] & pMVar5->uData[uVar6];
        uVar6 = uVar6 + 1;
        if ((~(uVar8 >> 1 | uVar8) & 0x55555555) != 0) goto LAB_0035807e;
      }
      local_40 = pMVar5->pNext;
      __ptr[1] = 0;
      iVar10 = 0;
      local_38 = pMVar5;
      for (uVar6 = 0; uVar6 < (uVar7 >> 10 & 0xfff); uVar6 = uVar6 + 1) {
        uVar8 = pMVar5->uData[uVar6] >> 1 & pMVar5->uData[uVar6] &
                (pSharp->uData[uVar6] >> 1 ^ pSharp->uData[uVar6]) & 0x55555555;
        if (uVar8 != 0) {
          iVar11 = iVar10;
          for (uVar7 = 0; uVar7 < 0x20; uVar7 = uVar7 + 2) {
            if ((uVar8 >> (uVar7 & 0x1f) & 1) != 0) {
              uVar1 = __ptr[1];
              if (uVar1 == *__ptr) {
                uVar13 = uVar1 * 2;
                if ((int)uVar1 < 0x10) {
                  uVar13 = 0x10;
                }
                pvVar3 = *(void **)(__ptr + 2);
                if ((int)uVar1 < (int)uVar13) {
                  if (pvVar3 == (void *)0x0) {
                    pvVar3 = malloc((ulong)uVar13 << 2);
                  }
                  else {
                    pvVar3 = realloc(pvVar3,(ulong)uVar13 << 2);
                  }
                  *(void **)(__ptr + 2) = pvVar3;
                  if (pvVar3 == (void *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                  ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  *__ptr = uVar13;
                }
              }
              else {
                pvVar3 = *(void **)(__ptr + 2);
              }
              __ptr[1] = uVar1 + 1;
              *(int *)((long)pvVar3 + (long)(int)uVar1 * 4) = iVar11;
            }
            iVar11 = iVar11 + 1;
          }
          uVar7 = *(uint *)&pSharp->field_0x8;
          pMVar5 = local_38;
        }
        iVar10 = iVar10 + 0x10;
      }
      for (uVar6 = (ulong)__ptr[1]; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        lVar2 = *(long *)(__ptr + 2);
        iVar10 = *(int *)(lVar2 + -4 + uVar6 * 4);
        pMVar5->uData[iVar10 >> 4] =
             pMVar5->uData[iVar10 >> 4] ^ 3 << ((char)iVar10 * '\x02' & 0x1fU);
        if (uVar6 == 1) break;
        iVar10 = *(int *)(lVar2 + -4 + uVar6 * 4);
        uVar7 = pMVar5->uData[iVar10 >> 4];
        pMVar4 = Min_CubeAlloc(p);
        memcpy(pMVar4->uData,pMVar5->uData,(long)p->nWords << 2);
        *(uint *)&pMVar4->field_0x8 =
             *(uint *)&pMVar4->field_0x8 & 0x3fffff | *(uint *)&pMVar5->field_0x8 & 0xffc00000;
        iVar11 = *(int *)(lVar2 + -4 + uVar6 * 4);
        pMVar4->uData[iVar11 >> 4] =
             pMVar4->uData[iVar11 >> 4] ^
             (~(uVar7 >> ((char)iVar10 * '\x02' & 0x1fU)) & 3) << ((char)iVar11 * '\x02' & 0x1fU);
        pMVar9->pNext = pMVar4;
        pMVar9 = pMVar4;
        pMVar5 = pMVar4;
      }
      pMVar5->pNext = local_40;
      goto LAB_0035807e;
    }
    pSharp = pSharp->pNext;
  } while( true );
}

Assistant:

Min_Cube_t * Min_SopComplement( Min_Man_t * p, Min_Cube_t * pSharp )
{
     Vec_Int_t * vVars;
     Min_Cube_t * pCover, * pCube, * pNext, * pReady, * pThis, ** ppPrev;
     int Num, Value, i;

     // get the variables
     vVars = Vec_IntAlloc( 100 );
    // create the tautology cube
     pCover = Min_CubeAlloc( p );
     // sharp it with all cubes
     Min_CoverForEachCube( pSharp, pCube )
     Min_CoverForEachCubePrev( pCover, pThis, ppPrev )
     {
        if ( Min_CubesDisjoint( pThis, pCube ) )
            continue;
        // remember the next pointer
        pNext = pThis->pNext;
        // get the variables, in which pThis is '-' while pCube is fixed
        Min_CoverGetDisjVars( pThis, pCube, vVars );
        // generate the disjoint cubes
        pReady = pThis;
        Vec_IntForEachEntryReverse( vVars, Num, i )
        {
            // correct the literal
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 );
            if ( i == 0 )
                break;
            // create the new cube and clean this value
            Value = Min_CubeGetVar( pReady, vVars->pArray[i] );
            pReady = Min_CubeDup( p, pReady );
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 ^ Value );
            // add to the cover
            *ppPrev = pReady;
            ppPrev = &pReady->pNext;
        }
        pThis = pReady;
        pThis->pNext = pNext;
     }
     Vec_IntFree( vVars );

     // perform dist-1 merge and contain
     Min_CoverExpandRemoveEqual( p, pCover );
     Min_SopDist1Merge( p );
     Min_SopContain( p );
     return Min_CoverCollect( p, p->nVars );
}